

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void __thiscall CVmObjBigNum::wp8s(CVmObjBigNum *this,char *buf,int *ov)

{
  byte bVar1;
  byte bVar2;
  int carry;
  uint uVar3;
  size_t i;
  long lVar4;
  
  bVar2 = (this->super_CVmObject).ext_[4];
  wp8abs(this,buf,ov);
  if ((bVar2 & 1) == 0) {
    uVar3 = (byte)buf[7] & 0xffffff80;
  }
  else {
    bVar2 = 1;
    lVar4 = 0;
    do {
      bVar1 = buf[lVar4];
      buf[lVar4] = ~bVar1 + bVar2;
      bVar2 = bVar2 & (byte)(~bVar1 + bVar2) == '\0';
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    uVar3 = (uint)(-1 < buf[7]);
  }
  *ov = *ov | uVar3;
  return;
}

Assistant:

void CVmObjBigNum::wp8s(char *buf, int &ov) const
{
    /* note if the value is negative */
    int neg = get_neg(ext_);

    /* generate the absolute value */
    wp8abs(buf, ov);

    /* if it's negative, compute the 2's complement of the buffer */
    if (neg)
    {
        /* take the 2's complement */
        twos_complement_p8((unsigned char *)buf);

        /* if it didn't come out negative, we have an overflow */
        ov |= ((buf[7] & 0x80) == 0);
    }
    else
    {
        /* positive - the sign bit is set, we overflowed */
        ov |= (buf[7] & 0x80);
    }
}